

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardVariable.cpp
# Opt level: O3

StdVarPtr *
KDIS::DATA_TYPE::StandardVariable::FactoryDecodeStandardVariable
          (StdVarPtr *__return_storage_ptr__,KDataStream *stream)

{
  KUINT16 KVar1;
  IOCommunicationsNode *this;
  RefCounter *pRVar2;
  ostream *poVar3;
  KException *pKVar4;
  StandardVariable recordHeader;
  KStringStream ss;
  StandardVariable SStack_1f8;
  KString local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [392];
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 6) {
    pKVar4 = (KException *)__cxa_allocate_exception(0x30);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"FactoryDecodeStandardVariable","");
    KException::KException(pKVar4,(KString *)local_1a8,2);
    __cxa_throw(pKVar4,&KException::typeinfo,KException::~KException);
  }
  KVar1 = KDataStream::GetCurrentWritePosition(stream);
  StandardVariable(&SStack_1f8,stream);
  KDataStream::SetCurrentWritePosition(stream,KVar1);
  this = (IOCommunicationsNode *)
         FactoryDecoderUser<KDIS::DATA_TYPE::StandardVariable>::FactoryDecode
                   (SStack_1f8.m_ui32Type,stream);
  if (this == (IOCommunicationsNode *)0x0) {
    if (SStack_1f8.m_ui32Type == 0x157c) {
      this = (IOCommunicationsNode *)operator_new(0x18);
      IOEffect::IOEffect((IOEffect *)this,stream);
    }
    else {
      if (SStack_1f8.m_ui32Type != 0x157d) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1a8 + 0x10),"Unsupported StandardVariable type(",0x22);
        poVar3 = (ostream *)
                 std::ostream::operator<<((ostream *)(local_1a8 + 0x10),SStack_1f8.m_ui32Type);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,").",2);
        pKVar4 = (KException *)__cxa_allocate_exception(0x30);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,"FactoryDecodeStandardVariable","");
        std::__cxx11::stringbuf::str();
        KException::KException<std::__cxx11::string>(pKVar4,&local_1e8,9,&local_1c8);
        __cxa_throw(pKVar4,&KException::typeinfo,KException::~KException);
      }
      this = (IOCommunicationsNode *)operator_new(0x20);
      IOCommunicationsNode::IOCommunicationsNode(this,stream);
    }
  }
  __return_storage_ptr__->_vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_00312e88;
  __return_storage_ptr__->m_pRef = &this->super_StandardVariable;
  pRVar2 = (RefCounter *)operator_new(2);
  __return_storage_ptr__->m_piCount = pRVar2;
  *pRVar2 = 1;
  ~StandardVariable(&SStack_1f8);
  return __return_storage_ptr__;
}

Assistant:

StdVarPtr StandardVariable::FactoryDecodeStandardVariable(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < STANDARD_VARIABLE_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    // We want to peek at the next data and then roll back for a full decode.
    KUINT16 savePos = stream.GetCurrentWritePosition();

    // First decode the header so we can determine what type of record we are dealing with.
    StandardVariable recordHeader( stream );

    // Reset stream
    stream.SetCurrentWritePosition( savePos );

	// First check for a custom decoder.
	StandardVariable * p = FactoryDecode( recordHeader.GetStandardVariableType(), stream );

	if( p )
	{
		return StdVarPtr( p );
	}

	// Check for a KDIS implementation of the type.
    switch( recordHeader.GetStandardVariableType() )
    {
		case IOCommunicationsNodeRecord   : return new IOCommunicationsNode( stream );
		case IOEffectRecord               : return new IOEffect( stream );

		// TODO: DE Records
		//case DEPrecisionAimpointRecord        : return new IOEffect( stream );
		//case DEAreaAimpointRecord             : return new IOEffect( stream );
    }

    /*****************************************************************

    We could choose to ignore the record. To do so uncomment the following
    and comment out the exception throwing.

    // Move the buffer to the next readable data.
    stream.SetCurrentWritePosition( ui16SavePos + recordHeader.GetRecordLength() );
    return 0; // make sure the null ptr is handled.

    *****************************************************************/

    // We could not decode the StandardVariable child class. We will treat this as an error.	
	KStringStream ss;
	ss << "Unsupported StandardVariable type(" << recordHeader.GetStandardVariableType() << ").";
	throw KException( __FUNCTION__, UNSUPPORTED_DATATYPE, ss.str() );
}